

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

void __thiscall
ImageT<unsigned_char,_3U>::ImageT(ImageT<unsigned_char,_3U> *this,uint32_t w,uint32_t h)

{
  _func_int **pp_Var1;
  bad_alloc *this_00;
  uint in_EDX;
  uint in_ESI;
  Image *in_RDI;
  uint32_t c;
  uint32_t p;
  size_t bytes;
  uint local_2c;
  uint local_28;
  
  Image::Image(in_RDI,in_ESI,in_EDX);
  in_RDI->_vptr_Image = (_func_int **)&PTR__ImageT_00431688;
  pp_Var1 = (_func_int **)malloc((ulong)in_ESI * 3 * (ulong)in_EDX);
  in_RDI[1]._vptr_Image = pp_Var1;
  if (in_RDI[1]._vptr_Image == (_func_int **)0x0) {
    this_00 = (bad_alloc *)__cxa_allocate_exception(8);
    std::bad_alloc::bad_alloc(this_00);
    __cxa_throw(this_00,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  *(undefined1 *)&in_RDI[1].width = 1;
  for (local_28 = 0; local_28 < in_ESI * in_EDX; local_28 = local_28 + 1) {
    for (local_2c = 0; local_2c < 3; local_2c = local_2c + 1) {
      *(undefined1 *)((long)in_RDI[1]._vptr_Image + (ulong)local_2c + (ulong)local_28 * 3) = 0;
    }
  }
  return;
}

Assistant:

ImageT(uint32_t w, uint32_t h) : Image(w, h)
    {
        size_t bytes = sizeof(Color) * w * h;
        pixels = (Color*)malloc(bytes);
        if (!pixels)
            throw std::bad_alloc();

        freePixels = true;

        for (uint32_t p = 0; p < w * h; ++p)
            for(uint32_t c = 0; c < componentCount; ++c)
                pixels[p].comps[c] = componentType{0};
    }